

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>const&>
::
UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<phmap::priv::hash_internal::EnumClass_const*,std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>>>
          (UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>const&>
           *this,Flags matcher_flags,
          __normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
          first,__normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
                last)

{
  bool bVar1;
  testing *this_00;
  MatcherDescriberVec *this_01;
  EnumClass *matcher;
  MatcherDescriberInterface *local_78;
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> *local_70;
  Matcher<const_phmap::priv::hash_internal::EnumClass_&> *m;
  iterator __end0;
  iterator __begin0;
  vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
  *__range3;
  Matcher<const_phmap::priv::hash_internal::EnumClass_&> local_40;
  Flags local_24;
  UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>const&>
  *pUStack_20;
  Flags matcher_flags_local;
  UnorderedElementsAreMatcherImpl<const_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_&>
  *this_local;
  __normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
  last_local;
  __normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
  first_local;
  
  local_24 = matcher_flags;
  pUStack_20 = this;
  this_local = (UnorderedElementsAreMatcherImpl<const_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_&>
                *)last._M_current;
  last_local = first;
  MatcherInterface<const_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_&>
  ::MatcherInterface((MatcherInterface<const_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_&>
                      *)this);
  UnorderedElementsAreMatcherImplBase::UnorderedElementsAreMatcherImplBase
            ((UnorderedElementsAreMatcherImplBase *)(this + 8),local_24);
  *(undefined ***)this = &PTR__UnorderedElementsAreMatcherImpl_00348370;
  std::
  vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
  ::vector((vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
            *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
                        *)&this_local);
    if (!bVar1) break;
    this_00 = (testing *)
              __gnu_cxx::
              __normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
              ::operator*(&last_local);
    MatcherCast<phmap::priv::hash_internal::EnumClass_const&,phmap::priv::hash_internal::EnumClass>
              (&local_40,this_00,matcher);
    std::
    vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
    ::push_back((vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
                 *)(this + 0x28),&local_40);
    Matcher<const_phmap::priv::hash_internal::EnumClass_&>::~Matcher(&local_40);
    __gnu_cxx::
    __normal_iterator<const_phmap::priv::hash_internal::EnumClass_*,_std::vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>_>
    ::operator++(&last_local);
  }
  __end0 = std::
           vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
           ::begin((vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
                    *)(this + 0x28));
  m = (Matcher<const_phmap::priv::hash_internal::EnumClass_&> *)
      std::
      vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
      ::end((vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>
             *)(this + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>_>
                                *)&m);
    if (!bVar1) break;
    local_70 = &__gnu_cxx::
                __normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>_>
                ::operator*(&__end0)->
                super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>;
    this_01 = UnorderedElementsAreMatcherImplBase::matcher_describers
                        ((UnorderedElementsAreMatcherImplBase *)(this + 8));
    local_78 = MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::GetDescriber(local_70);
    std::
    vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
    ::push_back(this_01,&local_78);
    __gnu_cxx::
    __normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

UnorderedElementsAreMatcherImpl(UnorderedMatcherRequire::Flags matcher_flags,
                                  InputIter first, InputIter last)
      : UnorderedElementsAreMatcherImplBase(matcher_flags) {
    for (; first != last; ++first) {
      matchers_.push_back(MatcherCast<const Element&>(*first));
    }
    for (const auto& m : matchers_) {
      matcher_describers().push_back(m.GetDescriber());
    }
  }